

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cc
# Opt level: O3

t_object * xemmai::t_module::f_instantiate(wstring_view a_name)

{
  pthread_mutex_t *__mutex;
  long lVar1;
  t_pvalue *a_stack;
  ulong uVar2;
  ulong *puVar3;
  wstring_view a_path;
  wstring_view a_path_00;
  bool bVar4;
  undefined8 uVar5;
  wchar_t *pwVar6;
  int iVar7;
  pthread_mutex_t *__mutex_00;
  const_iterator cVar8;
  undefined8 *puVar9;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 aVar10;
  t_object *ptVar11;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *__str_00;
  uintptr_t t;
  wchar_t *extraout_RDX;
  wchar_t *extraout_RDX_00;
  wchar_t *pwVar12;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 aVar13;
  wchar_t *extraout_RDX_01;
  t_object *unaff_RBP;
  wchar_t *in_RSI;
  t_object *in_RDI;
  _Rb_tree<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_xemmai::t_slot>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_xemmai::t_slot>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_xemmai::t_slot>_>_>
  *__const_this;
  t_pvalue *a_fields;
  long in_FS_OFFSET;
  undefined1 auVar14 [16];
  wstring_view a_path_01;
  wstring_view a_name_00;
  wstring_view a_path_02;
  wstring_view a_name_01;
  wstring_view a_message;
  wstring_view a_message_00;
  wstring_view a_message_01;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> __str;
  t_object *p;
  wstring path;
  wchar_t *in_stack_ffffffffffffff28;
  undefined1 local_c8 [16];
  undefined1 local_b8 [24];
  wchar_t *local_a0;
  t_object *local_98;
  t_pvalue local_90;
  t_object *local_80;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_70;
  size_t local_50;
  t_object *local_48;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 local_40;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 local_38;
  
  lVar1 = *(long *)(in_FS_OFFSET + -0x60);
  local_b8._16_8_ = in_RDI;
  local_a0 = in_RSI;
  __mutex_00 = (pthread_mutex_t *)
               t_lock_with_safe_region<std::recursive_mutex>::f_lock
                         ((recursive_mutex *)(lVar1 + 0x410));
  __mutex = (pthread_mutex_t *)(lVar1 + 0x170);
  iVar7 = pthread_mutex_lock(__mutex);
  if (iVar7 != 0) {
    std::__throw_system_error(iVar7);
  }
  cVar8 = std::
          _Rb_tree<std::__cxx11::wstring,std::pair<std::__cxx11::wstring_const,xemmai::t_slot>,std::_Select1st<std::pair<std::__cxx11::wstring_const,xemmai::t_slot>>,std::less<void>,std::allocator<std::pair<std::__cxx11::wstring_const,xemmai::t_slot>>>
          ::_M_lower_bound_tr<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,void>
                    ((_Rb_tree<std::__cxx11::wstring,std::pair<std::__cxx11::wstring_const,xemmai::t_slot>,std::_Select1st<std::pair<std::__cxx11::wstring_const,xemmai::t_slot>>,std::less<void>,std::allocator<std::pair<std::__cxx11::wstring_const,xemmai::t_slot>>>
                      *)(lVar1 + 0x3e0),
                     (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)(local_b8 + 0x10));
  if (((cVar8._M_node == (_Base_ptr)(lVar1 + 1000)) ||
      ((t_object *)local_b8._16_8_ != (t_object *)cVar8._M_node[1]._M_parent)) ||
     (((t_object *)local_b8._16_8_ != (t_object *)0x0 &&
      (iVar7 = wmemcmp(local_a0,*(wchar_t **)(cVar8._M_node + 1),local_b8._16_8_), iVar7 != 0)))) {
    pthread_mutex_unlock(__mutex);
    local_48 = *(t_object **)(lVar1 + 0x4a0);
    local_50 = local_48->v_type->v_fields_offset;
    lVar1 = *(long *)(in_FS_OFFSET + -0x78);
    ptVar11 = *(t_object **)(lVar1 + 0x2e0);
    a_stack = *(t_pvalue **)(in_FS_OFFSET + -0x30);
    *(t_pvalue **)(in_FS_OFFSET + -0x30) = a_stack + 2;
    a_stack[1].super_t_pointer.v_p = (t_object *)0x0;
    uVar2 = *(ulong *)(local_48->v_data + (local_50 - 0x48));
    puVar9 = (undefined8 *)(lVar1 + 0x10 + uVar2 * 8);
    if (4 < uVar2) {
      puVar9 = (undefined8 *)(uVar2 + 0x40);
    }
    local_90.super_t_pointer.v_p = *(t_object **)(local_48->v_data + (local_50 - 0x48));
    local_90.field_0 =
         *(anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 *)
          (local_48->v_data + (local_50 - 0x40));
    a_fields = a_stack;
    t_type_of<xemmai::t_object>::f_invoke
              ((t_type_of<xemmai::t_object> *)*puVar9,&local_90,ptVar11,&f_instantiate::index,
               a_stack,0);
    local_98 = (a_stack->super_t_pointer).v_p;
    local_40 = a_stack->field_0;
    *(t_pvalue **)(in_FS_OFFSET + -0x30) = a_stack;
    if ((local_98 != (t_object *)0x3) &&
       ((((local_98 < (t_object *)0x3 || (local_98 == (t_object *)0x4)) ||
         (local_98->v_type->v_depth == 0)) ||
        ((undefined8 *)local_98->v_type->v_ids[1] != &v__type_id<long>)))) {
      f_throw_type_error<unsigned_long>(L"size");
    }
    aVar13.v_integer = 0;
    do {
      aVar10 = local_40;
      if ((t_object *)0x4 < local_98) {
        aVar10 = *(anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 *)local_98->v_data;
      }
      if ((ulong)aVar10 <= (ulong)aVar13) {
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::wstring::_M_construct<wchar_t_const*>
                  ((wstring *)&local_70,local_a0,local_a0 + local_b8._16_8_);
        std::operator+((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *
                       )local_c8,L"module \"",&local_70);
        __str_00 = std::__cxx11::
                   basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>::
                   append((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)local_c8,L"\" not found.");
        std::__cxx11::wstring::wstring((wstring *)&local_90,__str_00);
        a_message_00._M_str = extraout_RDX_01;
        a_message_00._M_len = (size_t)local_90.super_t_pointer.v_p;
        f_throw((xemmai *)local_90.field_0,a_message_00);
      }
      uVar2 = *(ulong *)(local_48->v_data + (local_50 - 0x48));
      if (uVar2 < 5) {
        a_message_01._M_str = (wchar_t *)aVar13.v_integer;
        a_message_01._M_len = (size_t)L"not supported.";
        f_throw((xemmai *)0xe,a_message_01);
      }
      puVar3 = *(ulong **)(in_FS_OFFSET + -0x30);
      *(ulong **)(in_FS_OFFSET + -0x30) = puVar3 + 6;
      puVar3[4] = 3;
      ((anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 *)(puVar3 + 5))->v_integer =
           (intptr_t)aVar13;
      local_38 = aVar13;
      auVar14 = (**(code **)(*(long *)(uVar2 + 0x40) + 0xd0))(uVar2,puVar3);
      while( true ) {
        a_message._M_str = auVar14._8_8_;
        if (auVar14._0_8_ == -1) break;
        uVar2 = *puVar3;
        if (uVar2 < 5) {
          a_message._M_len = (size_t)L"not supported.";
          f_throw((xemmai *)0xe,a_message);
        }
        auVar14 = (**(code **)(*(long *)(uVar2 + 0x40) + 0xb8))(uVar2,puVar3,auVar14._0_8_);
      }
      uVar2 = *puVar3;
      *(ulong **)(in_FS_OFFSET + -0x30) = puVar3;
      if (((uVar2 < 5) || (*(long *)(*(long *)(uVar2 + 0x40) + 8) == 0)) ||
         (*(undefined8 **)(*(long *)(*(long *)(uVar2 + 0x40) + 0x10) + 8) !=
          &v__type_id<xemmai::t_string>)) {
        f_throw_type_error<xemmai::t_string>(L"path");
      }
      a_path_01._M_str = (wchar_t *)(uVar2 + 0x50);
      a_path_01._M_len = *(size_t *)(uVar2 + 0x48);
      portable::t_path::t_path((t_path *)&local_70,a_path_01);
      a_path_00._M_str = local_a0;
      a_path_00._M_len = local_b8._16_8_;
      portable::t_path::operator/((t_path *)local_c8,(t_path *)&local_70,a_path_00);
      local_90.super_t_pointer.v_p = (t_object *)&local_80;
      std::__cxx11::wstring::_M_construct<wchar_t*>
                ((wstring *)&local_90,local_c8._0_8_,(pointer)(local_c8._0_8_ + local_c8._8_8_ * 4))
      ;
      if ((t_object *)local_c8._0_8_ != (t_object *)local_b8) {
        operator_delete((void *)local_c8._0_8_,local_b8._0_8_ * 4 + 4);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity * 4 + 4);
      }
      local_c8._0_8_ = local_b8;
      std::__cxx11::wstring::_M_construct<wchar_t*>
                ((wstring *)local_c8,local_90.super_t_pointer.v_p,
                 (local_90.super_t_pointer.v_p)->v_data + local_90.field_0.v_integer * 4 + -0x48);
      std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>::
      append((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_c8,
             L".xm");
      a_path._M_str = in_stack_ffffffffffffff28;
      a_path._M_len = 0x13164d;
      ptVar11 = f_load_script(a_path);
      pwVar12 = extraout_RDX;
      if ((t_object *)local_c8._0_8_ != (t_object *)local_b8) {
        operator_delete((void *)local_c8._0_8_,local_b8._0_8_ * 4 + 4);
        pwVar12 = extraout_RDX_00;
      }
      pwVar6 = local_a0;
      uVar5 = local_b8._16_8_;
      if (ptVar11 == (t_object *)0x0) {
        a_path_02._M_str = pwVar12;
        a_path_02._M_len = (size_t)local_90.super_t_pointer.v_p;
        ptVar11 = f_load_library((t_module *)local_90.field_0,a_path_02);
        pwVar12 = local_a0;
        uVar5 = local_b8._16_8_;
        if (ptVar11 != (t_object *)0x0) {
          (**(code **)(*(long *)ptVar11->v_data + 0x18))((t_object *)local_c8,ptVar11->v_data);
          a_name_01._M_str = (wchar_t *)ptVar11;
          a_name_01._M_len = (size_t)pwVar12;
          unaff_RBP = f_new((t_module *)uVar5,a_name_01,(t_object *)local_c8,
                            (vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
                             *)a_fields);
          goto LAB_001316e5;
        }
        bVar4 = true;
      }
      else {
        pwVar12 = *(wchar_t **)ptVar11->v_data;
        f_execute_script((vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
                          *)local_c8,ptVar11);
        a_name_00._M_str = pwVar12;
        a_name_00._M_len = (size_t)pwVar6;
        unaff_RBP = f_new((t_module *)uVar5,a_name_00,(t_object *)local_c8,
                          (vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
                           *)a_fields);
LAB_001316e5:
        std::
        vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
        ::~vector((vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
                   *)local_c8);
        bVar4 = false;
      }
      if (local_90.super_t_pointer.v_p != (t_object *)&local_80) {
        operator_delete(local_90.super_t_pointer.v_p,(long)local_80 * 4 + 4);
      }
      aVar13.v_integer = local_38.v_integer + 1;
    } while (bVar4);
  }
  else {
    *(undefined1 *)(*(long *)(cVar8._M_node + 2) + 0x19) = 1;
    pthread_mutex_unlock(__mutex);
    unaff_RBP = *(t_object **)(cVar8._M_node + 2);
  }
  pthread_mutex_unlock(__mutex_00);
  return unaff_RBP;
}

Assistant:

t_object* t_module::f_instantiate(std::wstring_view a_name)
{
	auto engine = f_engine();
	t_lock_with_safe_region lock(engine->v_module__instantiate__mutex);
	engine->v_object__reviving__mutex.lock();
	{
		auto& instances = engine->v_module__instances;
		auto i = instances.lower_bound(a_name);
		if (i != instances.end() && i->first == a_name) {
			i->second->v_reviving = true;
			engine->v_object__reviving__mutex.unlock();
			return i->second;
		}
	}
	engine->v_object__reviving__mutex.unlock();
	auto& paths = engine->f_module_system()->f_fields()[/*path*/0];
	static size_t index;
	auto n = paths.f_invoke(f_global()->f_symbol_size(), index);
	f_check<size_t>(n, L"size");
	for (size_t i = 0; i < f_as<size_t>(n); ++i) {
		auto x = paths.f_get_at(i);
		f_check<t_string>(x, L"path");
		std::wstring path = portable::t_path(x->f_as<t_string>()) / a_name;
		if (auto code = f_load_script(path + L".xm")) return f_new(a_name, code->f_as<t_code>().v_module, f_execute_script(code));
		if (auto body = f_load_library(path)) return f_new(a_name, body, body->f_as<t_library>().f_define());
	}
	f_throw(L"module \"" + std::wstring(a_name) + L"\" not found.");
}